

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlparser.cpp
# Opt level: O2

void __thiscall UrlParserTest::email_url::test_method(email_url *this)

{
  undefined1 local_248 [8];
  UrlParser parser;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  string local_78;
  string local_58;
  undefined1 local_31;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"mailto:username@example.com",(allocator<char> *)&local_78);
  httpparser::UrlParser::UrlParser((UrlParser *)local_248,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  parser.url._256_8_ = anon_var_dwarf_9ec8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&parser.url.integerPort,0x76);
  local_58._M_string_length._0_1_ = 0;
  local_58._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_58.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_58.field_2._8_8_ = (long)"\"\"" + 2;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_110 = "";
  local_78._M_dataplus._M_p._0_1_ = local_248[0];
  local_31 = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_58,&local_118,0x76,1,2,&local_78,"parser.isValid()",&local_31,"true");
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_100 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_108,0x77);
  local_58._M_string_length._0_1_ = 0;
  local_58._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_58.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_58.field_2._8_8_ = (long)"\"\"" + 2;
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_a0 = "";
  httpparser::UrlParser::scheme_abi_cxx11_(&local_78,(UrlParser *)local_248);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
            (&local_58,&local_a8,0x77,1,2,&local_78,"parser.scheme()","mailto","\"mailto\"");
  std::__cxx11::string::~string((string *)&local_78);
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_e0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x78);
  local_58._M_string_length._0_1_ = 0;
  local_58._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_58.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_58.field_2._8_8_ = (long)"\"\"" + 2;
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_90 = "";
  httpparser::UrlParser::username_abi_cxx11_(&local_78,(UrlParser *)local_248);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[9]>
            (&local_58,&local_98,0x78,1,2,&local_78,"parser.username()","username","\"username\"");
  std::__cxx11::string::~string((string *)&local_78);
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_c0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c8,0x79);
  local_58._M_string_length._0_1_ = 0;
  local_58._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_58.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_58.field_2._8_8_ = (long)"\"\"" + 2;
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_80 = "";
  httpparser::UrlParser::hostname_abi_cxx11_(&local_78,(UrlParser *)local_248);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[12]>
            (&local_58,&local_88,0x79,1,2,&local_78,"parser.hostname()","example.com",
             "\"example.com\"");
  std::__cxx11::string::~string((string *)&local_78);
  httpparser::UrlParser::Url::~Url((Url *)&parser);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(email_url)
{
    const char *text = "mailto:username@example.com";
    UrlParser parser(text);

    BOOST_CHECK_EQUAL(parser.isValid(), true);
    BOOST_CHECK_EQUAL(parser.scheme(), "mailto");
    BOOST_CHECK_EQUAL(parser.username(), "username");
    BOOST_CHECK_EQUAL(parser.hostname(), "example.com");
}